

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-validation.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  long *plVar7;
  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pjVar8;
  ulong uVar9;
  initializer_list_t init;
  initializer_list_t init_00;
  initializer_list_t init_01;
  initializer_list_t init_02;
  initializer_list_t init_03;
  initializer_list_t init_04;
  initializer_list_t init_05;
  initializer_list_t init_06;
  initializer_list_t init_07;
  initializer_list_t init_08;
  initializer_list_t init_09;
  initializer_list_t init_10;
  initializer_list_t init_11;
  initializer_list_t init_12;
  initializer_list_t init_13;
  initializer_list_t init_14;
  store_ptr_err_handler err;
  validator val;
  json binary;
  validator val_no_content;
  string as_binary;
  binary_t arr;
  undefined1 local_370 [32];
  _Alloc_hider local_350;
  undefined1 local_348 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  _Alloc_hider local_310;
  undefined1 local_308 [24];
  json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_2f0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2d8;
  undefined1 local_2c8 [8];
  json_ref<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_2c0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2a8;
  undefined8 local_298;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_290;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_280;
  json_uri local_270;
  long *local_1b8;
  long local_1b0;
  long local_1a8 [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_198;
  undefined8 uStack_180;
  undefined1 local_178;
  _Any_data local_168;
  code *local_158;
  undefined8 uStack_150;
  _Any_data local_148;
  code *local_138;
  undefined8 uStack_130;
  _Any_data local_128;
  code *local_118;
  undefined8 uStack_110;
  _Any_data local_108;
  code *local_f8;
  undefined8 uStack_f0;
  _Any_data local_e8;
  code *local_d8;
  undefined8 uStack_d0;
  content_checker local_c0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_90;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_50;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d8 = (code *)0x0;
  uStack_d0 = 0;
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  local_f8 = (code *)0x0;
  uStack_f0 = 0;
  local_c0.super__Function_base._M_functor._8_8_ = 0;
  local_c0.super__Function_base._M_functor._M_unused._M_object = content;
  local_c0._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
       ::_M_invoke;
  local_c0.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
       ::_M_manager;
  nlohmann::json_schema::json_validator::json_validator
            ((json_validator *)local_348,(schema_loader *)&local_e8,(format_checker *)&local_108,
             &local_c0);
  if (local_c0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_c0.super__Function_base._M_manager)
              ((_Any_data *)&local_c0,(_Any_data *)&local_c0,__destroy_functor);
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,__destroy_functor);
  }
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_180 = 0;
  local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178 = 0;
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"hello world","");
  if (0 < local_1b0) {
    uVar9 = local_1b0 + 1;
    plVar7 = local_1b8;
    do {
      local_270.urn_._M_dataplus._M_p._0_1_ = (undefined1)*plVar7;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&local_198,(uchar *)&local_270);
      plVar7 = (long *)((long)plVar7 + 1);
      uVar9 = uVar9 - 1;
    } while (1 < uVar9);
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::binary(&local_280,&local_198);
  local_370[8] = 0;
  local_370._0_8_ = &PTR__store_ptr_err_handler_00159d60;
  local_370._16_8_ =
       (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_370._24_8_ =
       (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_350._M_p = (pointer)0x0;
  nlohmann::json_schema::json_validator::set_root_schema
            ((json_validator *)local_348,&bson_schema_abi_cxx11_);
  local_320._8_8_ = 0;
  local_320._M_local_buf[0] = 3;
  local_320._8_8_ =
       nlohmann::json_abi_v3_11_2::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       ::create<std::__cxx11::string,char_const(&)[16]>((char (*) [16])0x1417d7);
  local_310._M_p = (pointer)0x0;
  local_308._8_8_ = 0;
  local_308[0] = string;
  local_308._8_8_ =
       nlohmann::json_abi_v3_11_2::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       ::create<std::__cxx11::string,char_const(&)[12]>((char (*) [12])"some string");
  local_308._16_8_ = 0;
  init._M_len = 2;
  init._M_array = (iterator)&local_320;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_2f0.owned_value,init,true,array);
  local_2f0.value_ref = (value_type *)0x0;
  local_2c0.owned_value.m_value.object = (object_t *)0x0;
  local_2c0.owned_value.m_type = string;
  local_2c0.owned_value.m_value.object =
       (object_t *)
       nlohmann::json_abi_v3_11_2::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       ::create<std::__cxx11::string,char_const(&)[12]>((char (*) [12])0x1417ca);
  local_2c0.value_ref = (value_type *)0x0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_2a8,&local_280);
  local_298 = 0;
  init_00._M_len = 2;
  init_00._M_array = &local_2c0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_2d8,init_00,true,array);
  local_2c8 = (undefined1  [8])0x0;
  init_01._M_len = 2;
  init_01._M_array = &local_2f0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_290,init_01,true,array);
  local_340._M_allocated_capacity = (size_type)(object_t *)&local_330;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_348 + 8),"#","");
  nlohmann::json_uri::json_uri(&local_270,(string *)(local_348 + 8));
  nlohmann::json_schema::json_validator::validate
            ((json_validator *)&local_40,(json *)local_348,(error_handler *)&local_290,
             (json_uri *)local_370);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_40);
  nlohmann::json_uri::~json_uri(&local_270);
  if ((object_t *)local_340._M_allocated_capacity != (object_t *)&local_330) {
    operator_delete((void *)local_340._M_allocated_capacity,local_330._M_allocated_capacity + 1);
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_290);
  lVar6 = 0x18;
  do {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(&local_2f0.owned_value.m_type + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  lVar6 = 0x18;
  do {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(&local_2c0.owned_value.m_type + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  lVar6 = 0x18;
  do {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)((long)&local_320 + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  if (local_370._24_8_ != local_370._16_8_) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failed: \'",9);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' != \'",6);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
    error_count = error_count + 1;
  }
  uVar3 = local_370._24_8_;
  uVar2 = local_370._16_8_;
  local_370[8] = 0;
  pjVar8 = (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_370._16_8_;
  if (local_370._24_8_ != local_370._16_8_) {
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&pjVar8->reference_tokens);
      pjVar8 = pjVar8 + 1;
    } while (pjVar8 != (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)uVar3);
    local_370._24_8_ = uVar2;
  }
  local_2f0.owned_value.m_value.object = (object_t *)0x0;
  local_2f0.owned_value.m_type = string;
  local_2f0.owned_value.m_value.object =
       (object_t *)
       nlohmann::json_abi_v3_11_2::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       ::create<std::__cxx11::string,char_const(&)[12]>((char (*) [12])0x1417ca);
  local_2f0.value_ref = (value_type *)0x0;
  local_2d8.m_value.object = (object_t *)0x0;
  local_2d8.m_type = string;
  local_2d8.m_value.object =
       (object_t *)
       nlohmann::json_abi_v3_11_2::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       ::create<std::__cxx11::string,char_const(&)[31]>
                 ((char (*) [31])"string, but expect binary data");
  local_2c8 = (undefined1  [8])0x0;
  init_02._M_len = 2;
  init_02._M_array = &local_2f0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_2c0.owned_value,init_02,true,array);
  local_2c0.value_ref = (value_type *)0x0;
  init_03._M_len = 1;
  init_03._M_array = &local_2c0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)(local_348 + 8),init_03,true,array);
  local_320._M_allocated_capacity = (size_type)&local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"#","");
  nlohmann::json_uri::json_uri(&local_270,(string *)&local_320);
  nlohmann::json_schema::json_validator::validate
            ((json_validator *)&local_50,(json *)local_348,(error_handler *)(local_348 + 8),
             (json_uri *)local_370);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_50);
  nlohmann::json_uri::~json_uri(&local_270);
  if ((_Alloc_hider *)local_320._M_allocated_capacity != &local_310) {
    operator_delete((void *)local_320._M_allocated_capacity,(ulong)(local_310._M_p + 1));
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)(local_348 + 8));
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_2c0.owned_value);
  lVar6 = 0x18;
  do {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(&local_2f0.owned_value.m_type + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  if (local_370._24_8_ - local_370._16_8_ != 0x18) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failed: \'",9);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' != \'",6);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
    error_count = error_count + 1;
  }
  nlohmann::json_abi_v3_11_2::
  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  to_string(&local_270.urn_,
            (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_370._16_8_);
  iVar4 = std::__cxx11::string::compare((char *)&local_270);
  paVar1 = &local_270.urn_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_270.urn_._M_dataplus._M_p._1_7_,local_270.urn_._M_dataplus._M_p._0_1_) !=
      paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_270.urn_._M_dataplus._M_p._1_7_,
                             local_270.urn_._M_dataplus._M_p._0_1_),
                    local_270.urn_.field_2._M_allocated_capacity + 1);
  }
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failed: \'",9);
    nlohmann::json_abi_v3_11_2::
    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    to_string(&local_270.urn_,
              (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_370._16_8_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,
                        (char *)CONCAT71(local_270.urn_._M_dataplus._M_p._1_7_,
                                         local_270.urn_._M_dataplus._M_p._0_1_),
                        local_270.urn_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' != \'",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/binary_data",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_270.urn_._M_dataplus._M_p._1_7_,local_270.urn_._M_dataplus._M_p._0_1_) !=
        paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_270.urn_._M_dataplus._M_p._1_7_,
                               local_270.urn_._M_dataplus._M_p._0_1_),
                      local_270.urn_.field_2._M_allocated_capacity + 1);
    }
    error_count = error_count + 1;
  }
  uVar3 = local_370._24_8_;
  uVar2 = local_370._16_8_;
  local_370[8] = 0;
  pjVar8 = (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_370._16_8_;
  if (local_370._24_8_ != local_370._16_8_) {
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&pjVar8->reference_tokens);
      pjVar8 = pjVar8 + 1;
    } while (pjVar8 != (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)uVar3);
    local_370._24_8_ = uVar2;
  }
  local_320._8_8_ = 0;
  local_320._M_local_buf[0] = 3;
  local_320._8_8_ =
       nlohmann::json_abi_v3_11_2::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       ::create<std::__cxx11::string,char_const(&)[16]>((char (*) [16])0x1417d7);
  local_310._M_p = (pointer)0x0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_308,&local_280);
  local_308._16_8_ = 0;
  init_04._M_len = 2;
  init_04._M_array = (iterator)&local_320;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_2f0.owned_value,init_04,true,array);
  local_2f0.value_ref = (value_type *)0x0;
  local_2c0.owned_value.m_value.object = (object_t *)0x0;
  local_2c0.owned_value.m_type = string;
  local_2c0.owned_value.m_value.object =
       (object_t *)
       nlohmann::json_abi_v3_11_2::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       ::create<std::__cxx11::string,char_const(&)[12]>((char (*) [12])0x1417ca);
  local_2c0.value_ref = (value_type *)0x0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_2a8,&local_280);
  local_298 = 0;
  init_05._M_len = 2;
  init_05._M_array = &local_2c0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_2d8,init_05,true,array);
  local_2c8 = (undefined1  [8])0x0;
  init_06._M_len = 2;
  init_06._M_array = &local_2f0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_290,init_06,true,array);
  local_340._M_allocated_capacity = (size_type)(object_t *)&local_330;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_348 + 8),"#","");
  nlohmann::json_uri::json_uri(&local_270,(string *)(local_348 + 8));
  nlohmann::json_schema::json_validator::validate
            ((json_validator *)&local_60,(json *)local_348,(error_handler *)&local_290,
             (json_uri *)local_370);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_60);
  nlohmann::json_uri::~json_uri(&local_270);
  if ((object_t *)local_340._M_allocated_capacity != (object_t *)&local_330) {
    operator_delete((void *)local_340._M_allocated_capacity,local_330._M_allocated_capacity + 1);
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_290);
  lVar6 = 0x18;
  do {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(&local_2f0.owned_value.m_type + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  lVar6 = 0x18;
  do {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(&local_2c0.owned_value.m_type + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  lVar6 = 0x18;
  do {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)((long)&local_320 + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  if (local_370._24_8_ - local_370._16_8_ != 0x18) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failed: \'",9);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' != \'",6);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
    error_count = error_count + 1;
  }
  nlohmann::json_abi_v3_11_2::
  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  to_string(&local_270.urn_,
            (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_370._16_8_);
  iVar4 = std::__cxx11::string::compare((char *)&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_270.urn_._M_dataplus._M_p._1_7_,local_270.urn_._M_dataplus._M_p._0_1_) !=
      paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_270.urn_._M_dataplus._M_p._1_7_,
                             local_270.urn_._M_dataplus._M_p._0_1_),
                    local_270.urn_.field_2._M_allocated_capacity + 1);
  }
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failed: \'",9);
    nlohmann::json_abi_v3_11_2::
    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    to_string(&local_270.urn_,
              (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_370._16_8_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,
                        (char *)CONCAT71(local_270.urn_._M_dataplus._M_p._1_7_,
                                         local_270.urn_._M_dataplus._M_p._0_1_),
                        local_270.urn_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' != \'",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/standard_string",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_270.urn_._M_dataplus._M_p._1_7_,local_270.urn_._M_dataplus._M_p._0_1_) !=
        paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_270.urn_._M_dataplus._M_p._1_7_,
                               local_270.urn_._M_dataplus._M_p._0_1_),
                      local_270.urn_.field_2._M_allocated_capacity + 1);
    }
    error_count = error_count + 1;
  }
  uVar3 = local_370._24_8_;
  uVar2 = local_370._16_8_;
  local_370[8] = 0;
  pjVar8 = (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_370._16_8_;
  if (local_370._24_8_ != local_370._16_8_) {
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&pjVar8->reference_tokens);
      pjVar8 = pjVar8 + 1;
    } while (pjVar8 != (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)uVar3);
    local_370._24_8_ = uVar2;
  }
  nlohmann::json_schema::json_validator::set_root_schema
            ((json_validator *)local_348,&array_of_types_abi_cxx11_);
  local_2f0.owned_value.m_value.object = (object_t *)0x0;
  local_2f0.owned_value.m_type = string;
  local_2f0.owned_value.m_value.object =
       (object_t *)
       nlohmann::json_abi_v3_11_2::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       ::create<std::__cxx11::string,char_const(&)[10]>((char (*) [10])0x1417e8);
  local_2f0.value_ref = (value_type *)0x0;
  local_2d8.m_type = null;
  local_2d8.m_value.object = (object_t *)0x0;
  nlohmann::json_abi_v3_11_2::detail::
  external_constructor<(nlohmann::json_abi_v3_11_2::detail::value_t)5>::
  construct<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_2d8,1);
  local_2c8 = (undefined1  [8])0x0;
  init_07._M_len = 2;
  init_07._M_array = &local_2f0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_2c0.owned_value,init_07,true,array);
  local_2c0.value_ref = (value_type *)0x0;
  init_08._M_len = 1;
  init_08._M_array = &local_2c0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)(local_348 + 8),init_08,true,array);
  local_320._M_allocated_capacity = (size_type)&local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"#","");
  nlohmann::json_uri::json_uri(&local_270,(string *)&local_320);
  nlohmann::json_schema::json_validator::validate
            ((json_validator *)&local_70,(json *)local_348,(error_handler *)(local_348 + 8),
             (json_uri *)local_370);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_70);
  nlohmann::json_uri::~json_uri(&local_270);
  if ((_Alloc_hider *)local_320._M_allocated_capacity != &local_310) {
    operator_delete((void *)local_320._M_allocated_capacity,(ulong)(local_310._M_p + 1));
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)(local_348 + 8));
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_2c0.owned_value);
  lVar6 = 0x18;
  do {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(&local_2f0.owned_value.m_type + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  local_2f0.owned_value.m_value.object = (object_t *)0x0;
  local_2f0.owned_value.m_type = string;
  local_2f0.owned_value.m_value.object =
       (object_t *)
       nlohmann::json_abi_v3_11_2::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       ::create<std::__cxx11::string,char_const(&)[10]>((char (*) [10])0x1417e8);
  local_2f0.value_ref = (value_type *)0x0;
  local_2d8.m_type = null;
  local_2d8.m_value.object = (object_t *)0x0;
  nlohmann::json_abi_v3_11_2::detail::
  external_constructor<(nlohmann::json_abi_v3_11_2::detail::value_t)4>::
  construct<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_2d8,false);
  local_2c8 = (undefined1  [8])0x0;
  init_09._M_len = 2;
  init_09._M_array = &local_2f0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_2c0.owned_value,init_09,true,array);
  local_2c0.value_ref = (value_type *)0x0;
  init_10._M_len = 1;
  init_10._M_array = &local_2c0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)(local_348 + 8),init_10,true,array);
  local_320._M_allocated_capacity = (size_type)&local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"#","");
  nlohmann::json_uri::json_uri(&local_270,(string *)&local_320);
  nlohmann::json_schema::json_validator::validate
            ((json_validator *)&local_80,(json *)local_348,(error_handler *)(local_348 + 8),
             (json_uri *)local_370);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_80);
  nlohmann::json_uri::~json_uri(&local_270);
  if ((_Alloc_hider *)local_320._M_allocated_capacity != &local_310) {
    operator_delete((void *)local_320._M_allocated_capacity,(ulong)(local_310._M_p + 1));
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)(local_348 + 8));
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_2c0.owned_value);
  lVar6 = 0x18;
  do {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(&local_2f0.owned_value.m_type + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  if (local_370._24_8_ != local_370._16_8_) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failed: \'",9);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' != \'",6);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
    error_count = error_count + 1;
  }
  uVar3 = local_370._24_8_;
  uVar2 = local_370._16_8_;
  local_370[8] = 0;
  pjVar8 = (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_370._16_8_;
  if (local_370._24_8_ != local_370._16_8_) {
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&pjVar8->reference_tokens);
      pjVar8 = pjVar8 + 1;
    } while (pjVar8 != (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)uVar3);
    local_370._24_8_ = uVar2;
  }
  local_2f0.owned_value.m_value.object = (object_t *)0x0;
  local_2f0.owned_value.m_type = string;
  local_2f0.owned_value.m_value.object =
       (object_t *)
       nlohmann::json_abi_v3_11_2::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       ::create<std::__cxx11::string,char_const(&)[10]>((char (*) [10])0x1417e8);
  local_2f0.value_ref = (value_type *)0x0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_2d8,&local_280);
  local_2c8 = (undefined1  [8])0x0;
  init_11._M_len = 2;
  init_11._M_array = &local_2f0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_2c0.owned_value,init_11,true,array);
  local_2c0.value_ref = (value_type *)0x0;
  init_12._M_len = 1;
  init_12._M_array = &local_2c0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)(local_348 + 8),init_12,true,array);
  local_320._M_allocated_capacity = (size_type)&local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"#","");
  nlohmann::json_uri::json_uri(&local_270,(string *)&local_320);
  nlohmann::json_schema::json_validator::validate
            ((json_validator *)&local_90,(json *)local_348,(error_handler *)(local_348 + 8),
             (json_uri *)local_370);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_90);
  nlohmann::json_uri::~json_uri(&local_270);
  if ((_Alloc_hider *)local_320._M_allocated_capacity != &local_310) {
    operator_delete((void *)local_320._M_allocated_capacity,(ulong)(local_310._M_p + 1));
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)(local_348 + 8));
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_2c0.owned_value);
  lVar6 = 0x18;
  do {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(&local_2f0.owned_value.m_type + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  if (local_370._24_8_ != local_370._16_8_) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failed: \'",9);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' != \'",6);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
    error_count = error_count + 1;
  }
  uVar3 = local_370._24_8_;
  uVar2 = local_370._16_8_;
  local_370[8] = 0;
  pjVar8 = (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_370._16_8_;
  if (local_370._24_8_ != local_370._16_8_) {
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&pjVar8->reference_tokens);
      pjVar8 = pjVar8 + 1;
    } while (pjVar8 != (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)uVar3);
    local_370._24_8_ = uVar2;
  }
  nlohmann::json_schema::json_validator::set_root_schema
            ((json_validator *)local_348,&array_of_types_without_binary_abi_cxx11_);
  local_2f0.owned_value.m_value.object = (object_t *)0x0;
  local_2f0.owned_value.m_type = string;
  local_2f0.owned_value.m_value.object =
       (object_t *)
       nlohmann::json_abi_v3_11_2::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       ::create<std::__cxx11::string,char_const(&)[10]>((char (*) [10])0x1417e8);
  local_2f0.value_ref = (value_type *)0x0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_2d8,&local_280);
  local_2c8 = (undefined1  [8])0x0;
  init_13._M_len = 2;
  init_13._M_array = &local_2f0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_2c0.owned_value,init_13,true,array);
  local_2c0.value_ref = (value_type *)0x0;
  init_14._M_len = 1;
  init_14._M_array = &local_2c0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)(local_348 + 8),init_14,true,array);
  local_320._M_allocated_capacity = (size_type)&local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"#","");
  nlohmann::json_uri::json_uri(&local_270,(string *)&local_320);
  nlohmann::json_schema::json_validator::validate
            ((json_validator *)&local_a0,(json *)local_348,(error_handler *)(local_348 + 8),
             (json_uri *)local_370);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_a0);
  nlohmann::json_uri::~json_uri(&local_270);
  if ((_Alloc_hider *)local_320._M_allocated_capacity != &local_310) {
    operator_delete((void *)local_320._M_allocated_capacity,(ulong)(local_310._M_p + 1));
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)(local_348 + 8));
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_2c0.owned_value);
  lVar6 = 0x18;
  do {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(&local_2f0.owned_value.m_type + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  if (local_370._24_8_ - local_370._16_8_ != 0x18) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failed: \'",9);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' != \'",6);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
    error_count = error_count + 1;
  }
  nlohmann::json_abi_v3_11_2::
  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  to_string(&local_270.urn_,
            (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_370._16_8_);
  iVar4 = std::__cxx11::string::compare((char *)&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_270.urn_._M_dataplus._M_p._1_7_,local_270.urn_._M_dataplus._M_p._0_1_) !=
      paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_270.urn_._M_dataplus._M_p._1_7_,
                             local_270.urn_._M_dataplus._M_p._0_1_),
                    local_270.urn_.field_2._M_allocated_capacity + 1);
  }
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failed: \'",9);
    nlohmann::json_abi_v3_11_2::
    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    to_string(&local_270.urn_,
              (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_370._16_8_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,
                        (char *)CONCAT71(local_270.urn_._M_dataplus._M_p._1_7_,
                                         local_270.urn_._M_dataplus._M_p._0_1_),
                        local_270.urn_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' != \'",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/something",10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_270.urn_._M_dataplus._M_p._1_7_,local_270.urn_._M_dataplus._M_p._0_1_) !=
        paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_270.urn_._M_dataplus._M_p._1_7_,
                               local_270.urn_._M_dataplus._M_p._0_1_),
                      local_270.urn_.field_2._M_allocated_capacity + 1);
    }
    error_count = error_count + 1;
  }
  uVar3 = local_370._24_8_;
  uVar2 = local_370._16_8_;
  local_370[8] = 0;
  pjVar8 = (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_370._16_8_;
  if (local_370._24_8_ != local_370._16_8_) {
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&pjVar8->reference_tokens);
      pjVar8 = pjVar8 + 1;
    } while (pjVar8 != (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)uVar3);
    local_370._24_8_ = uVar2;
  }
  local_128._M_unused._M_object = (void *)0x0;
  local_128._8_8_ = 0;
  local_118 = (code *)0x0;
  uStack_110 = 0;
  local_148._M_unused._M_object = (void *)0x0;
  local_148._8_8_ = 0;
  local_138 = (code *)0x0;
  uStack_130 = 0;
  local_168._M_unused._M_object = (void *)0x0;
  local_168._8_8_ = 0;
  local_158 = (code *)0x0;
  uStack_150 = 0;
  nlohmann::json_schema::json_validator::json_validator
            ((json_validator *)&local_270,(schema_loader *)&local_128,(format_checker *)&local_148,
             (content_checker *)&local_168);
  if (local_158 != (code *)0x0) {
    (*local_158)(&local_168,&local_168,__destroy_functor);
  }
  if (local_138 != (code *)0x0) {
    (*local_138)(&local_148,&local_148,__destroy_functor);
  }
  if (local_118 != (code *)0x0) {
    (*local_118)(&local_128,&local_128,__destroy_functor);
  }
  nlohmann::json_schema::json_validator::set_root_schema
            ((json_validator *)&local_270,&bson_schema_abi_cxx11_);
  iVar4 = error_count + 1;
  error_count = iVar4;
  nlohmann::json_schema::json_validator::~json_validator((json_validator *)&local_270);
  local_370._0_8_ = &PTR__store_ptr_err_handler_00159d60;
  std::
  vector<nlohmann::json_abi_v3_11_2::json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<nlohmann::json_abi_v3_11_2::json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_370 + 0x10));
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_280);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  if (local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  nlohmann::json_schema::json_validator::~json_validator((json_validator *)local_348);
  return iVar4;
}

Assistant:

int main()
{
	validator val(nullptr, nullptr, content);

	// create some bson doc
	json::binary_t arr;
	std::string as_binary = "hello world";
	std::copy(as_binary.begin(), as_binary.end(), std::back_inserter(arr));

	json binary = json::binary(arr);

	store_ptr_err_handler err;

	/////////////////////////////////////
	val.set_root_schema(bson_schema);

	// all right
	val.validate({{"standard_string", "some string"}, {"binary_data", binary}}, err);
	EXPECT_EQ(err.failed_pointers.size(), 0);
	err.reset();

	// invalid binary data
	val.validate({{"binary_data", "string, but expect binary data"}}, err);
	EXPECT_EQ(err.failed_pointers.size(), 1);
	EXPECT_EQ(err.failed_pointers[0].to_string(), "/binary_data");
	err.reset();

	// also check that simple string not accept binary data
	val.validate({{"standard_string", binary}, {"binary_data", binary}}, err);
	EXPECT_EQ(err.failed_pointers.size(), 1);
	EXPECT_EQ(err.failed_pointers[0].to_string(), "/standard_string");
	err.reset();

	/////////////////////////////////////
	// check with array of types

	// check simple types
	val.set_root_schema(array_of_types);
	val.validate({{"something", 1}}, err);
	val.validate({{"something", false}}, err);
	// TODO when we set `string` in array and set `contentEncoding` = "binary" - what it means? We expected string or binary?
	// Or we expect only binary? Now if you set `contentEncoding` = "binary", then it means that you expect only binary data,
	// not string
	// val.validate({{"something", "string"}}, err); -> produce error about type
	EXPECT_EQ(err.failed_pointers.size(), 0);
	err.reset();

	// check binary data
	val.validate({{"something", binary}}, err);
	EXPECT_EQ(err.failed_pointers.size(), 0);
	err.reset();

	/////////////////////////////////////
	// and check that you can't set binary data if contentEncoding don't set
	val.set_root_schema(array_of_types_without_binary);
	val.validate({{"something", binary}}, err);
	EXPECT_EQ(err.failed_pointers.size(), 1);
	EXPECT_EQ(err.failed_pointers[0].to_string(), "/something");
	err.reset();

	// check that without content callback you get exception with schema with contentEncoding or contentMeditType
	validator val_no_content;

	EXPECT_THROW(val_no_content.set_root_schema(bson_schema));

	return error_count;
}